

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int glfwUpdateGamepadMappings(char *string)

{
  GLFWbool GVar1;
  _GLFWmapping *p_Var2;
  size_t sVar3;
  _GLFWjoystick *js;
  _GLFWmapping *previous;
  _GLFWmapping mapping;
  size_t length;
  char line [1024];
  char *c;
  int jid;
  char *string_local;
  
  line._1016_8_ = string;
  if (string == (char *)0x0) {
    __assert_fail("string != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jeertmans[P]DelaunayTriangulation/deps/BOV/deps/glfw/src/input.c"
                  ,0x48a,"int glfwUpdateGamepadMappings(const char *)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    string_local._4_4_ = 0;
  }
  else {
    while (*(char *)line._1016_8_ != '\0') {
      if ((((*(char *)line._1016_8_ < '0') || ('9' < *(char *)line._1016_8_)) &&
          ((*(char *)line._1016_8_ < 'a' || ('f' < *(char *)line._1016_8_)))) &&
         ((*(char *)line._1016_8_ < 'A' || ('F' < *(char *)line._1016_8_)))) {
        sVar3 = strcspn((char *)line._1016_8_,"\r\n");
        line._1016_8_ = sVar3 + line._1016_8_;
        sVar3 = strspn((char *)line._1016_8_,"\r\n");
        line._1016_8_ = sVar3 + line._1016_8_;
      }
      else {
        mapping.axes._16_8_ = strcspn((char *)line._1016_8_,"\r\n");
        if ((ulong)mapping.axes._16_8_ < 0x400) {
          memset((void *)((long)&previous + 3),0,0xf5);
          memcpy(&length,(void *)line._1016_8_,mapping.axes._16_8_);
          line[mapping.axes._16_8_ + -8] = '\0';
          GVar1 = parseMapping((_GLFWmapping *)((long)&previous + 3),(char *)&length);
          if (GVar1 != 0) {
            p_Var2 = findMapping(mapping.name + 0x78);
            if (p_Var2 == (_GLFWmapping *)0x0) {
              _glfw.mappingCount = _glfw.mappingCount + 1;
              _glfw.mappings =
                   (_GLFWmapping *)realloc(_glfw.mappings,(long)_glfw.mappingCount * 0xf5);
              memcpy(_glfw.mappings + (_glfw.mappingCount + -1),(void *)((long)&previous + 3),0xf5);
            }
            else {
              memcpy(p_Var2,(void *)((long)&previous + 3),0xf5);
            }
          }
        }
        line._1016_8_ = mapping.axes._16_8_ + line._1016_8_;
      }
    }
    for (c._4_4_ = 0; c._4_4_ < 0x10; c._4_4_ = c._4_4_ + 1) {
      if (_glfw.joysticks[c._4_4_].present != 0) {
        p_Var2 = findValidMapping(_glfw.joysticks + c._4_4_);
        _glfw.joysticks[c._4_4_].mapping = p_Var2;
      }
    }
    string_local._4_4_ = 1;
  }
  return string_local._4_4_;
}

Assistant:

GLFWAPI int glfwUpdateGamepadMappings(const char* string)
{
    int jid;
    const char* c = string;

    assert(string != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    while (*c)
    {
        if ((*c >= '0' && *c <= '9') ||
            (*c >= 'a' && *c <= 'f') ||
            (*c >= 'A' && *c <= 'F'))
        {
            char line[1024];

            const size_t length = strcspn(c, "\r\n");
            if (length < sizeof(line))
            {
                _GLFWmapping mapping = {{0}};

                memcpy(line, c, length);
                line[length] = '\0';

                if (parseMapping(&mapping, line))
                {
                    _GLFWmapping* previous = findMapping(mapping.guid);
                    if (previous)
                        *previous = mapping;
                    else
                    {
                        _glfw.mappingCount++;
                        _glfw.mappings =
                            realloc(_glfw.mappings,
                                    sizeof(_GLFWmapping) * _glfw.mappingCount);
                        _glfw.mappings[_glfw.mappingCount - 1] = mapping;
                    }
                }
            }

            c += length;
        }
        else
        {
            c += strcspn(c, "\r\n");
            c += strspn(c, "\r\n");
        }
    }

    for (jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        _GLFWjoystick* js = _glfw.joysticks + jid;
        if (js->present)
            js->mapping = findValidMapping(js);
    }

    return GLFW_TRUE;
}